

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O1

tmsize_t TIFFWriteEncodedStrip(TIFF *tif,uint32_t strip,void *data,tmsize_t cc)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  char *extraout_RDX;
  char *module;
  
  module = (char *)data;
  if (((tif->tif_flags & 0x40) != 0) ||
     (iVar5 = TIFFWriteCheck(tif,0,"TIFFWriteEncodedStrip"), module = extraout_RDX, iVar5 != 0)) {
    if (strip < (tif->tif_dir).td_nstrips) {
LAB_002b8af3:
      if ((((tif->tif_flags & 0x10) == 0) || (tif->tif_rawdata == (uint8_t *)0x0)) &&
         (iVar5 = TIFFWriteBufferSetup(tif,(void *)0x0,-1), iVar5 == 0)) {
        return -1;
      }
      pbVar1 = (byte *)((long)&tif->tif_flags + 2);
      *pbVar1 = *pbVar1 | 0x10;
      tif->tif_curstrip = strip;
      tif->tif_curoff = 0;
      iVar5 = _TIFFReserveLargeEnoughWriteBuffer(tif,strip);
      if (iVar5 == 0) {
        return -1;
      }
      tif->tif_rawcc = 0;
      tif->tif_rawcp = tif->tif_rawdata;
      uVar2 = (tif->tif_dir).td_stripsperimage;
      if (uVar2 == 0) {
        TIFFErrorExtR(tif,"TIFFWriteEncodedStrip","Zero strips per image");
        return -1;
      }
      tif->tif_row = (strip % uVar2) * (tif->tif_dir).td_rowsperstrip;
      if ((tif->tif_flags & 0x20) == 0) {
        iVar5 = (*tif->tif_setupencode)(tif);
        if (iVar5 == 0) {
          return -1;
        }
        *(byte *)&tif->tif_flags = (byte)tif->tif_flags | 0x20;
      }
      pbVar1 = (byte *)((long)&tif->tif_flags + 1);
      *pbVar1 = *pbVar1 & 0xef;
      if ((tif->tif_dir).td_compression == 1) {
        (*tif->tif_postdecode)(tif,(uint8_t *)data,cc);
        if ((tif->tif_flags & ((tif->tif_dir).td_fillorder | 0x100)) == 0) {
          TIFFReverseBits((uint8_t *)data,cc);
        }
        if (cc < 1) {
          return cc;
        }
        iVar5 = TIFFAppendToStrip(tif,strip,(uint8_t *)data,cc);
        if (iVar5 != 0) {
          return cc;
        }
        return -1;
      }
      uVar4 = (uint16_t)(strip / (tif->tif_dir).td_stripsperimage);
      iVar5 = (*tif->tif_preencode)(tif,uVar4);
      if (iVar5 == 0) {
        return -1;
      }
      (*tif->tif_postdecode)(tif,(uint8_t *)data,cc);
      iVar5 = (*tif->tif_encodestrip)(tif,(uint8_t *)data,cc,uVar4);
      if (iVar5 == 0) {
        return -1;
      }
      iVar5 = (*tif->tif_postencode)(tif);
      if (iVar5 == 0) {
        return -1;
      }
      if ((tif->tif_flags & ((tif->tif_dir).td_fillorder | 0x100)) == 0) {
        TIFFReverseBits(tif->tif_rawdata,tif->tif_rawcc);
      }
      if ((0 < tif->tif_rawcc) &&
         (iVar5 = TIFFAppendToStrip(tif,strip,tif->tif_rawdata,tif->tif_rawcc), iVar5 == 0)) {
        return -1;
      }
      tif->tif_rawcc = 0;
      tif->tif_rawcp = tif->tif_rawdata;
      return cc;
    }
    if ((tif->tif_dir).td_planarconfig == 2) {
      TIFFErrorExtR(tif,"TIFFWriteEncodedStrip",
                    "Can not grow image by strips when using separate planes");
    }
    else {
      iVar5 = TIFFGrowStrips(tif,0x337350,module);
      if (iVar5 != 0) {
        uVar2 = (tif->tif_dir).td_imagelength;
        uVar3 = (tif->tif_dir).td_rowsperstrip;
        uVar6 = 0;
        if (uVar2 < -uVar3) {
          uVar6 = ((uVar2 + uVar3) - 1) / uVar3;
        }
        (tif->tif_dir).td_stripsperimage = uVar6;
        goto LAB_002b8af3;
      }
    }
  }
  return -1;
}

Assistant:

tmsize_t TIFFWriteEncodedStrip(TIFF *tif, uint32_t strip, void *data,
                               tmsize_t cc)
{
    static const char module[] = "TIFFWriteEncodedStrip";
    TIFFDirectory *td = &tif->tif_dir;
    uint16_t sample;

    if (!WRITECHECKSTRIPS(tif, module))
        return ((tmsize_t)-1);
    /*
     * Check strip array to make sure there's space.
     * We don't support dynamically growing files that
     * have data organized in separate bitplanes because
     * it's too painful.  In that case we require that
     * the imagelength be set properly before the first
     * write (so that the strips array will be fully
     * allocated above).
     */
    if (strip >= td->td_nstrips)
    {
        if (td->td_planarconfig == PLANARCONFIG_SEPARATE)
        {
            TIFFErrorExtR(
                tif, module,
                "Can not grow image by strips when using separate planes");
            return ((tmsize_t)-1);
        }
        if (!TIFFGrowStrips(tif, 1, module))
            return ((tmsize_t)-1);
        td->td_stripsperimage =
            TIFFhowmany_32(td->td_imagelength, td->td_rowsperstrip);
    }
    /*
     * Handle delayed allocation of data buffer.  This
     * permits it to be sized according to the directory
     * info.
     */
    if (!BUFFERCHECK(tif))
        return ((tmsize_t)-1);

    tif->tif_flags |= TIFF_BUF4WRITE;

    tif->tif_curstrip = strip;

    /* this informs TIFFAppendToStrip() we have changed or reset strip */
    tif->tif_curoff = 0;

    if (!_TIFFReserveLargeEnoughWriteBuffer(tif, strip))
    {
        return ((tmsize_t)(-1));
    }

    tif->tif_rawcc = 0;
    tif->tif_rawcp = tif->tif_rawdata;

    if (td->td_stripsperimage == 0)
    {
        TIFFErrorExtR(tif, module, "Zero strips per image");
        return ((tmsize_t)-1);
    }

    tif->tif_row = (strip % td->td_stripsperimage) * td->td_rowsperstrip;
    if ((tif->tif_flags & TIFF_CODERSETUP) == 0)
    {
        if (!(*tif->tif_setupencode)(tif))
            return ((tmsize_t)-1);
        tif->tif_flags |= TIFF_CODERSETUP;
    }

    tif->tif_flags &= ~TIFF_POSTENCODE;

    /* shortcut to avoid an extra memcpy() */
    if (td->td_compression == COMPRESSION_NONE)
    {
        /* swab if needed - note that source buffer will be altered */
        tif->tif_postdecode(tif, (uint8_t *)data, cc);

        if (!isFillOrder(tif, td->td_fillorder) &&
            (tif->tif_flags & TIFF_NOBITREV) == 0)
            TIFFReverseBits((uint8_t *)data, cc);

        if (cc > 0 && !TIFFAppendToStrip(tif, strip, (uint8_t *)data, cc))
            return ((tmsize_t)-1);
        return (cc);
    }

    sample = (uint16_t)(strip / td->td_stripsperimage);
    if (!(*tif->tif_preencode)(tif, sample))
        return ((tmsize_t)-1);

    /* swab if needed - note that source buffer will be altered */
    tif->tif_postdecode(tif, (uint8_t *)data, cc);

    if (!(*tif->tif_encodestrip)(tif, (uint8_t *)data, cc, sample))
        return ((tmsize_t)-1);
    if (!(*tif->tif_postencode)(tif))
        return ((tmsize_t)-1);
    if (!isFillOrder(tif, td->td_fillorder) &&
        (tif->tif_flags & TIFF_NOBITREV) == 0)
        TIFFReverseBits(tif->tif_rawdata, tif->tif_rawcc);
    if (tif->tif_rawcc > 0 &&
        !TIFFAppendToStrip(tif, strip, tif->tif_rawdata, tif->tif_rawcc))
        return ((tmsize_t)-1);
    tif->tif_rawcc = 0;
    tif->tif_rawcp = tif->tif_rawdata;
    return (cc);
}